

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

TermList * __thiscall
Lib::Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash>::insert
          (Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> *this,TermSpec *key,
          TermList *val,uint code)

{
  int iVar1;
  Entry *pEVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  anon_struct_8_0_00000001_for___align aVar4;
  ulong uVar5;
  uint uVar6;
  Entry *pEVar7;
  
  pEVar2 = this->_entries;
  uVar5 = (ulong)code % (ulong)(uint)this->_capacity;
  pEVar7 = pEVar2 + uVar5;
  uVar6 = pEVar2[uVar5].code;
  aVar3 = (anon_struct_8_0_00000001_for___align)(key->term)._content;
  if (uVar6 != 0) {
    do {
      if (((uVar6 == code) && ((pEVar7->_key).__align == aVar3)) &&
         (*(int *)((long)&pEVar7->_key + 8) == key->index)) goto LAB_002b4bc1;
      pEVar7 = pEVar7 + 1;
      if (pEVar7 == this->_afterLast) {
        pEVar7 = pEVar2;
      }
      uVar6 = pEVar7->code;
    } while (uVar6 != 0);
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  iVar1 = key->index;
  aVar4 = (anon_struct_8_0_00000001_for___align)val->_content;
  (pEVar7->_key).__align = aVar3;
  *(int *)((long)&pEVar7->_key + 8) = iVar1;
  (pEVar7->_value).__align = aVar4;
  pEVar7->code = code;
LAB_002b4bc1:
  return (TermList *)&pEVar7->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }